

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O3

void __thiscall
gl3cts::TransformFeedbackOverflowQueryFunctionalBase::endQueries
          (TransformFeedbackOverflowQueryFunctionalBase *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  uint uVar3;
  
  iVar2 = (*((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x628))(0x82ec);
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    (&this->super_TransformFeedbackOverflowQueryBaseTest);
  if ((bVar1) && ((this->super_TransformFeedbackOverflowQueryBaseTest).m_max_vertex_streams != 0)) {
    uVar3 = 0;
    do {
      (**(code **)(CONCAT44(extraout_var,iVar2) + 0x630))(0x82ed,uVar3);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (this->super_TransformFeedbackOverflowQueryBaseTest).m_max_vertex_streams);
  }
  return;
}

Assistant:

void endQueries()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.endQuery(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB);

		if (supportsTransformFeedback3())
		{
			for (GLuint i = 0; i < getMaxVertexStreams(); ++i)
			{
				gl.endQueryIndexed(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, i);
			}
		}
	}